

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddAPI.c
# Opt level: O3

double Cudd_ReadCacheUsedSlots(DdManager *dd)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  double dVar4;
  undefined1 auVar5 [16];
  
  uVar1 = dd->cacheSlots;
  if ((long)(int)uVar1 < 1) {
    dVar4 = 0.0;
  }
  else {
    lVar2 = 0;
    lVar3 = 0;
    do {
      lVar3 = (lVar3 + 1) - (ulong)(*(long *)((long)&dd->cache->h + lVar2) == 0);
      lVar2 = lVar2 + 0x28;
    } while ((long)(int)uVar1 * 0x28 != lVar2);
    auVar5._8_4_ = (int)((ulong)lVar3 >> 0x20);
    auVar5._0_8_ = lVar3;
    auVar5._12_4_ = 0x45300000;
    dVar4 = (auVar5._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)lVar3) - 4503599627370496.0);
  }
  return dVar4 / (double)uVar1;
}

Assistant:

double
Cudd_ReadCacheUsedSlots(
  DdManager * dd)
{
    unsigned long used = 0;
    int slots = dd->cacheSlots;
    DdCache *cache = dd->cache;
    int i;

    for (i = 0; i < slots; i++) {
        used += cache[i].h != 0;
    }

    return((double)used / (double) dd->cacheSlots);

}